

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error ft_open_face_internal
                   (FT_Library library,FT_Open_Args *args,FT_Long face_index,FT_Face_conflict *aface
                   ,FT_Bool test_mac_fonts)

{
  undefined8 *puVar1;
  short sVar2;
  FT_Memory pFVar3;
  FT_ListNode pFVar4;
  ulong uVar5;
  FT_Bitmap_Size *pFVar6;
  long lVar7;
  FT_Face_Internal pFVar8;
  bool bVar9;
  FT_Face library_00;
  uint uVar10;
  int iVar11;
  uint uVar12;
  unsigned_long uVar13;
  FT_ListNode pFVar14;
  FT_Stream pFVar15;
  FT_Stream pFVar16;
  FT_Face_conflict face_00;
  FT_Int num_params;
  undefined7 in_register_00000081;
  FT_Parameter *params;
  FT_ListRec *pFVar17;
  FT_Parameter *pFVar18;
  undefined4 uVar19;
  undefined8 unaff_R12;
  FT_Driver pFVar20;
  char cVar21;
  FT_Driver driver;
  FT_Error FVar22;
  FT_Module *ppFVar23;
  long lVar24;
  bool bVar25;
  FT_Long local_1d8;
  FT_Long offsets [9];
  undefined1 local_188 [8];
  FT_Open_Args args2;
  FT_Error errors [9];
  undefined8 local_118;
  char *file_names [9];
  char local_c6;
  byte local_c5;
  byte local_c4;
  byte local_c3;
  byte local_c2;
  FT_Stream local_98;
  FT_Open_Args *local_90;
  FT_Driver local_88;
  FT_Memory local_80;
  undefined8 local_78;
  FT_Stream local_70;
  FT_Face_conflict local_68;
  FT_Face face;
  FT_Face_conflict *local_58;
  FT_Stream local_50;
  FT_Stream stream;
  FT_Stream local_40;
  undefined4 local_34;
  
  local_40 = (FT_Stream)CONCAT44(local_40._4_4_,(int)CONCAT71(in_register_00000081,test_mac_fonts));
  local_50 = (FT_Stream)0x0;
  local_68 = (FT_Face)0x0;
  FVar22 = 6;
  if (args == (FT_Open_Args *)0x0) {
    return 6;
  }
  if (-1 < face_index && aface == (FT_Face_conflict *)0x0) {
    return 6;
  }
  if ((args->flags & 2) == 0) {
    uVar19 = 0;
  }
  else {
    uVar19 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),args->stream != (FT_Stream)0x0);
  }
  stream = (FT_Stream)face_index;
  uVar10 = FT_Stream_New(library,args,&local_50);
  local_90 = args;
  face = (FT_Face)library;
  local_34 = uVar19;
  if (uVar10 == 0) {
    local_80 = library->memory;
    if (((args->flags & 8) == 0) || (driver = (FT_Driver)args->driver, driver == (FT_Driver)0x0)) {
      if ((ulong)library->num_modules == 0) {
        uVar10 = 0xb;
        goto LAB_001ec319;
      }
      local_88 = (FT_Driver)(library->modules + library->num_modules);
      ppFVar23 = library->modules;
      uVar10 = 0xb;
      local_78 = CONCAT44(local_78._4_4_,uVar19) & 0xffffffff000000ff;
      pFVar20 = (FT_Driver)0x0;
      local_58 = aface;
      do {
        driver = (FT_Driver)*ppFVar23;
        if ((((driver->root).clazz)->module_flags & 1) != 0) {
          if ((local_90->flags & 0x10) == 0) {
            params = (FT_Parameter *)0x0;
            pFVar18 = (FT_Parameter *)0x0;
          }
          else {
            params = (FT_Parameter *)(ulong)(uint)local_90->num_params;
            pFVar18 = local_90->params;
          }
          uVar10 = open_face(driver,&local_50,(FT_Bool)local_78,(FT_Long)stream,(FT_Int)params,
                             pFVar18,&local_68);
          if (uVar10 == 0) {
            cVar21 = '\x03';
          }
          else if ((((char)local_40 == '\0') ||
                   (iVar11 = strcmp((*ppFVar23)->clazz->module_name,"truetype"), pFVar16 = local_50,
                   (char)uVar10 != -0x72)) || (iVar11 != 0)) {
LAB_001ec4e1:
            cVar21 = ((char)uVar10 != '\x02') * '\x02';
          }
          else {
            if (local_50->read == (FT_Stream_IoFunc)0x0) {
              uVar10 = 0;
              bVar25 = true;
            }
            else {
              uVar13 = (*local_50->read)(local_50,0,(uchar *)0x0,0);
              bVar25 = uVar13 == 0;
              uVar10 = 0x55;
              if (bVar25) {
                uVar10 = 0;
              }
            }
            if (bVar25) {
              pFVar16->pos = 0;
            }
            cVar21 = '\x05';
            if (uVar10 == 0) {
              uVar10 = open_face_PS_from_sfnt_stream
                                 ((FT_Library)face,pFVar16,(FT_Long)stream,(FT_Int)local_58,params,
                                  (FT_Face_conflict *)pFVar18);
              if (uVar10 != 0) goto LAB_001ec4e1;
              cVar21 = '\x01';
              FVar22 = 0;
              if (pFVar16 != (FT_Stream)0x0) {
                pFVar3 = pFVar16->memory;
                if (pFVar16->close != (FT_Stream_CloseFunc)0x0) {
                  local_70 = pFVar16;
                  (*pFVar16->close)(pFVar16);
                  pFVar16 = local_70;
                }
                if ((char)local_34 == '\0') {
                  (*pFVar3->free)(pFVar3,pFVar16);
                }
              }
            }
          }
          pFVar20 = driver;
          if (cVar21 != '\0') {
            aface = local_58;
            if (cVar21 != '\x02') {
              if (cVar21 == '\x03') goto LAB_001ec955;
              if (cVar21 != '\x05') {
                return FVar22;
              }
            }
            break;
          }
        }
        ppFVar23 = ppFVar23 + 1;
        aface = local_58;
      } while (ppFVar23 < local_88);
      goto LAB_001ec31c;
    }
    pFVar20 = driver;
    uVar12 = 0x20;
    if ((((driver->root).clazz)->module_flags & 1) == 0) goto LAB_001ec7b9;
    if ((args->flags & 0x10) == 0) {
      num_params = 0;
      pFVar18 = (FT_Parameter *)0x0;
    }
    else {
      num_params = args->num_params;
      pFVar18 = args->params;
    }
    uVar12 = open_face(driver,&local_50,(FT_Bool)uVar19,(FT_Long)stream,num_params,pFVar18,&local_68
                      );
    if (uVar12 != 0) goto LAB_001ec7b9;
LAB_001ec955:
    pFVar14 = (FT_ListNode)(*local_80->alloc)(local_80,0x18);
    face_00 = local_68;
    uVar12 = (uint)(pFVar14 == (FT_ListNode)0x0) << 6;
    if (pFVar14 == (FT_ListNode)0x0) {
      bVar25 = true;
    }
    else {
      pFVar14->prev = (FT_ListNode)0x0;
      pFVar14->next = (FT_ListNode)0x0;
      pFVar14->data = (void *)0x0;
      pFVar14->data = local_68;
      pFVar20 = local_68->driver;
      pFVar4 = (pFVar20->faces_list).tail;
      pFVar17 = (FT_ListRec *)&pFVar4->next;
      if (pFVar4 == (FT_ListNode)0x0) {
        pFVar17 = &pFVar20->faces_list;
      }
      pFVar14->next = (FT_ListNode)0x0;
      pFVar14->prev = pFVar4;
      pFVar17->head = pFVar14;
      (pFVar20->faces_list).tail = pFVar14;
      if ((long)stream < 0) {
LAB_001eca11:
        uVar5 = face_00->face_flags;
        if ((uVar5 & 1) != 0) {
          if (face_00->height < 0) {
            face_00->height = -face_00->height;
          }
          if ((uVar5 & 0x20) == 0) {
            face_00->max_advance_height = face_00->height;
          }
        }
        if (((uVar5 & 2) != 0) && (iVar11 = face_00->num_fixed_sizes, 0 < (long)iVar11)) {
          pFVar6 = face_00->available_sizes;
          lVar24 = 0;
          do {
            sVar2 = *(short *)((long)&pFVar6->height + lVar24);
            if (sVar2 < 0) {
              *(short *)((long)&pFVar6->height + lVar24) = -sVar2;
            }
            lVar7 = *(long *)((long)&pFVar6->x_ppem + lVar24);
            if (lVar7 < 0) {
              *(long *)((long)&pFVar6->x_ppem + lVar24) = -lVar7;
            }
            lVar7 = *(long *)((long)&pFVar6->y_ppem + lVar24);
            if (lVar7 < 0) {
              *(long *)((long)&pFVar6->y_ppem + lVar24) = -lVar7;
            }
            if (((*(short *)((long)&pFVar6->height + lVar24) < 0) ||
                (*(long *)((long)&pFVar6->x_ppem + lVar24) < 0)) ||
               (*(long *)((long)&pFVar6->y_ppem + lVar24) < 0)) {
              *(undefined4 *)((long)&pFVar6->height + lVar24) = 0;
              puVar1 = (undefined8 *)((long)&pFVar6->size + lVar24);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)((long)&pFVar6->y_ppem + lVar24) = 0;
            }
            lVar24 = lVar24 + 0x20;
          } while ((long)iVar11 * 0x20 != lVar24);
        }
        pFVar8 = face_00->internal;
        (pFVar8->transform_matrix).xx = 0x10000;
        (pFVar8->transform_matrix).xy = 0;
        (pFVar8->transform_matrix).yx = 0;
        (pFVar8->transform_matrix).yy = 0x10000;
        (pFVar8->transform_delta).x = 0;
        (pFVar8->transform_delta).y = 0;
        pFVar8->refcount = 1;
        pFVar8->no_stem_darkening = -1;
        if (aface != (FT_Face_conflict *)0x0) {
          *aface = face_00;
          return uVar12;
        }
        goto LAB_001ec807;
      }
      bVar25 = false;
      uVar12 = FT_New_GlyphSlot(local_68,(FT_GlyphSlot *)0x0);
      if (uVar12 == 0) {
        uVar12 = FT_New_Size(face_00,(FT_Size *)&local_118);
        if (uVar12 == 0) {
          face_00->size =
               (FT_Size)CONCAT62(local_118._2_6_,CONCAT11(local_118._1_1_,(FT_Byte)local_118));
          goto LAB_001eca11;
        }
        bVar25 = false;
      }
    }
  }
  else {
    local_80 = (FT_Memory)0x0;
LAB_001ec319:
    pFVar20 = (FT_Driver)0x0;
LAB_001ec31c:
    if ((((char)uVar10 == '\x02') || ((uVar10 & 0xff) == 0x55)) ||
       (uVar12 = uVar10, (uVar10 & 0xff) == 0x51)) {
      if ((char)local_40 != '\0') {
        local_40 = local_50;
        if (local_50 == (FT_Stream)0x0) {
          uVar10 = 0x55;
        }
        else {
          if (local_50->read == (FT_Stream_IoFunc)0x0) {
            bVar25 = true;
            uVar10 = 0;
          }
          else {
            uVar13 = (*local_50->read)(local_50,0,(uchar *)0x0,0);
            bVar25 = uVar13 == 0;
            uVar10 = 0x55;
            if (bVar25) {
              uVar10 = 0;
            }
          }
          if (bVar25) {
            local_40->pos = 0;
          }
          if (uVar10 == 0) {
            uVar10 = FT_Stream_Read(local_40,(FT_Byte *)&local_118,0x80);
            if ((((uVar10 == 0) && (uVar10 = 2, (FT_Byte)local_118 == '\0')) &&
                (((file_names[8]._2_1_ == '\0' &&
                  ((local_c6 == '\0' && (0xde < (byte)(local_118._1_1_ - 0x22))))) &&
                 (file_names[6]._7_1_ == '\0')))) &&
               (-1 < (char)local_c5 &&
                *(FT_Byte *)((long)&local_118 + (ulong)local_118._1_1_ + 2) == '\0')) {
              uVar10 = IsMacResource((FT_Library)face,local_40,
                                     ((ulong)((uint)local_c3 << 8 |
                                             (uint)local_c4 << 0x10 | (uint)local_c5 << 0x18) +
                                      (ulong)local_c2 + 0x7f & 0xffffffffffffff80) + 0x80,
                                     (FT_Long)stream,aface);
            }
          }
        }
        if ((char)uVar10 == '\x02') {
          uVar10 = IsMacResource((FT_Library)face,local_40,0,(FT_Long)stream,aface);
        }
        if ((((char)uVar10 == 'U') || ((uVar10 & 0xff) == 2)) && ((local_90->flags & 4) != 0)) {
          local_78 = face->num_faces;
          local_98 = (FT_Stream)0x0;
          local_88 = pFVar20;
          local_58 = aface;
          FT_Raccess_Guess((FT_Library)face,local_40,local_90->pathname,(char **)&local_118,
                           &local_1d8,(FT_Error *)&args2.params);
          iVar11 = 2;
          lVar24 = 0;
          bVar25 = false;
          do {
            library_00 = face;
            uVar10 = (&ft_raccess_guess_table[0].type)[lVar24] + ~FT_RFork_Rule_darwin_ufs_export;
            bVar9 = bVar25;
            if (((1 < uVar10) || (!bVar25)) && (*(int *)((long)errors + lVar24 + -8) == 0)) {
              local_188._0_4_ = 4;
              args2.memory_size = *(long *)((long)file_names + lVar24 * 2 + -8);
              if ((FT_String *)args2.memory_size == (FT_String *)0x0) {
                args2.memory_size = (FT_Long)local_90->pathname;
              }
              iVar11 = FT_Stream_New((FT_Library)face,(FT_Open_Args *)local_188,&local_98);
              pFVar16 = local_98;
              if ((char)iVar11 == 'Q') {
                bVar9 = true;
              }
              if (1 < uVar10) {
                bVar9 = bVar25;
              }
              if (iVar11 == 0) {
                iVar11 = IsMacResource((FT_Library)library_00,local_98,
                                       *(FT_Long *)((long)offsets + lVar24 * 2 + -8),(FT_Long)stream
                                       ,local_58);
                if (pFVar16 != (FT_Stream)0x0) {
                  pFVar15 = (FT_Stream)pFVar16->memory;
                  if (pFVar16->close != (FT_Stream_CloseFunc)0x0) {
                    local_70 = (FT_Stream)pFVar16->memory;
                    (*pFVar16->close)(pFVar16);
                    pFVar15 = local_70;
                  }
                  (*(FT_Free_Func)pFVar15->pos)((FT_Memory)pFVar15,pFVar16);
                }
                if (iVar11 == 0) {
                  iVar11 = 0;
                  break;
                }
                bVar9 = bVar25;
                if (uVar10 < 2) {
                  bVar9 = true;
                }
              }
            }
            bVar25 = bVar9;
            lVar24 = lVar24 + 4;
          } while (lVar24 != 0x24);
          uVar5 = local_78;
          pFVar20 = local_88;
          lVar24 = 0;
          do {
            if (file_names[lVar24 + -1] != (char *)0x0) {
              (**(code **)(uVar5 + 0x10))(uVar5);
              file_names[lVar24 + -1] = (char *)0x0;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != 9);
          uVar10 = (uint)(iVar11 != 0) * 2;
        }
        if (uVar10 == 0) {
          if (local_40 == (FT_Stream)0x0) {
            return 0;
          }
          pFVar3 = local_40->memory;
          if (local_40->close != (FT_Stream_CloseFunc)0x0) {
            (*local_40->close)(local_40);
          }
          if ((char)local_34 != '\0') {
            return 0;
          }
          (*pFVar3->free)(pFVar3,local_40);
          return 0;
        }
      }
      uVar12 = 2;
      if ((char)uVar10 != '\x02') {
        uVar12 = uVar10;
      }
    }
LAB_001ec7b9:
    pFVar16 = local_50;
    bVar25 = true;
    driver = pFVar20;
    if (local_50 != (FT_Stream)0x0) {
      pFVar3 = local_50->memory;
      if (local_50->close != (FT_Stream_CloseFunc)0x0) {
        (*local_50->close)(local_50);
      }
      if ((char)local_34 == '\0') {
        (*pFVar3->free)(pFVar3,pFVar16);
      }
    }
  }
  face_00 = local_68;
  if (bVar25) {
    if (local_68 == (FT_Face)0x0) {
      return uVar12;
    }
    destroy_face(local_80,local_68,driver);
    return uVar12;
  }
LAB_001ec807:
  FT_Done_Face(face_00);
  return uVar12;
}

Assistant:

static FT_Error
  ft_open_face_internal( FT_Library           library,
                         const FT_Open_Args*  args,
                         FT_Long              face_index,
                         FT_Face             *aface,
                         FT_Bool              test_mac_fonts )
  {
    FT_Error     error;
    FT_Driver    driver = NULL;
    FT_Memory    memory = NULL;
    FT_Stream    stream = NULL;
    FT_Face      face   = NULL;
    FT_ListNode  node   = NULL;
    FT_Bool      external_stream;
    FT_Module*   cur;
    FT_Module*   limit;

#ifndef FT_CONFIG_OPTION_MAC_FONTS
    FT_UNUSED( test_mac_fonts );
#endif


#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE3(( "FT_Open_Face: " ));
    if ( face_index < 0 )
      FT_TRACE3(( "Requesting number of faces and named instances\n"));
    else
    {
      FT_TRACE3(( "Requesting face %ld", face_index & 0xFFFFL ));
      if ( face_index & 0x7FFF0000L )
        FT_TRACE3(( ", named instance %ld", face_index >> 16 ));
      FT_TRACE3(( "\n" ));
    }
#endif

    /* test for valid `library' delayed to `FT_Stream_New' */

    if ( ( !aface && face_index >= 0 ) || !args )
      return FT_THROW( Invalid_Argument );

    external_stream = FT_BOOL( ( args->flags & FT_OPEN_STREAM ) &&
                               args->stream                     );

    /* create input stream */
    error = FT_Stream_New( library, args, &stream );
    if ( error )
      goto Fail3;

    memory = library->memory;

    /* If the font driver is specified in the `args' structure, use */
    /* it.  Otherwise, we scan the list of registered drivers.      */
    if ( ( args->flags & FT_OPEN_DRIVER ) && args->driver )
    {
      driver = FT_DRIVER( args->driver );

      /* not all modules are drivers, so check... */
      if ( FT_MODULE_IS_DRIVER( driver ) )
      {
        FT_Int         num_params = 0;
        FT_Parameter*  params     = NULL;


        if ( args->flags & FT_OPEN_PARAMS )
        {
          num_params = args->num_params;
          params     = args->params;
        }

        error = open_face( driver, &stream, external_stream, face_index,
                           num_params, params, &face );
        if ( !error )
          goto Success;
      }
      else
        error = FT_THROW( Invalid_Handle );

      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }
    else
    {
      error = FT_ERR( Missing_Module );

      /* check each font driver for an appropriate format */
      cur   = library->modules;
      limit = cur + library->num_modules;

      for ( ; cur < limit; cur++ )
      {
        /* not all modules are font drivers, so check... */
        if ( FT_MODULE_IS_DRIVER( cur[0] ) )
        {
          FT_Int         num_params = 0;
          FT_Parameter*  params     = NULL;


          driver = FT_DRIVER( cur[0] );

          if ( args->flags & FT_OPEN_PARAMS )
          {
            num_params = args->num_params;
            params     = args->params;
          }

          error = open_face( driver, &stream, external_stream, face_index,
                             num_params, params, &face );
          if ( !error )
            goto Success;

#ifdef FT_CONFIG_OPTION_MAC_FONTS
          if ( test_mac_fonts                                           &&
               ft_strcmp( cur[0]->clazz->module_name, "truetype" ) == 0 &&
               FT_ERR_EQ( error, Table_Missing )                        )
          {
            /* TrueType but essential tables are missing */
            error = FT_Stream_Seek( stream, 0 );
            if ( error )
              break;

            error = open_face_PS_from_sfnt_stream( library,
                                                   stream,
                                                   face_index,
                                                   num_params,
                                                   params,
                                                   aface );
            if ( !error )
            {
              FT_Stream_Free( stream, external_stream );
              return error;
            }
          }
#endif

          if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
            goto Fail3;
        }
      }

    Fail3:
      /* If we are on the mac, and we get an                          */
      /* FT_Err_Invalid_Stream_Operation it may be because we have an */
      /* empty data fork, so we need to check the resource fork.      */
      if ( FT_ERR_NEQ( error, Cannot_Open_Stream )       &&
           FT_ERR_NEQ( error, Unknown_File_Format )      &&
           FT_ERR_NEQ( error, Invalid_Stream_Operation ) )
        goto Fail2;

#if !defined( FT_MACINTOSH ) && defined( FT_CONFIG_OPTION_MAC_FONTS )
      if ( test_mac_fonts )
      {
        error = load_mac_face( library, stream, face_index, aface, args );
        if ( !error )
        {
          /* We don't want to go to Success here.  We've already done   */
          /* that.  On the other hand, if we succeeded we still need to */
          /* close this stream (we opened a different stream which      */
          /* extracted the interesting information out of this stream   */
          /* here.  That stream will still be open and the face will    */
          /* point to it).                                              */
          FT_Stream_Free( stream, external_stream );
          return error;
        }
      }

      if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
        goto Fail2;
#endif  /* !FT_MACINTOSH && FT_CONFIG_OPTION_MAC_FONTS */

      /* no driver is able to handle this format */
      error = FT_THROW( Unknown_File_Format );

  Fail2:
      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }

  Success:
    FT_TRACE4(( "FT_Open_Face: New face object, adding to list\n" ));

    /* add the face object to its driver's list */
    if ( FT_NEW( node ) )
      goto Fail;

    node->data = face;
    /* don't assume driver is the same as face->driver, so use */
    /* face->driver instead.                                   */
    FT_List_Add( &face->driver->faces_list, node );

    /* now allocate a glyph slot object for the face */
    FT_TRACE4(( "FT_Open_Face: Creating glyph slot\n" ));

    if ( face_index >= 0 )
    {
      error = FT_New_GlyphSlot( face, NULL );
      if ( error )
        goto Fail;

      /* finally, allocate a size object for the face */
      {
        FT_Size  size;


        FT_TRACE4(( "FT_Open_Face: Creating size object\n" ));

        error = FT_New_Size( face, &size );
        if ( error )
          goto Fail;

        face->size = size;
      }
    }

    /* some checks */

    if ( FT_IS_SCALABLE( face ) )
    {
      if ( face->height < 0 )
        face->height = (FT_Short)-face->height;

      if ( !FT_HAS_VERTICAL( face ) )
        face->max_advance_height = (FT_Short)face->height;
    }

    if ( FT_HAS_FIXED_SIZES( face ) )
    {
      FT_Int  i;


      for ( i = 0; i < face->num_fixed_sizes; i++ )
      {
        FT_Bitmap_Size*  bsize = face->available_sizes + i;


        if ( bsize->height < 0 )
          bsize->height = -bsize->height;
        if ( bsize->x_ppem < 0 )
          bsize->x_ppem = -bsize->x_ppem;
        if ( bsize->y_ppem < 0 )
          bsize->y_ppem = -bsize->y_ppem;

        /* check whether negation actually has worked */
        if ( bsize->height < 0 || bsize->x_ppem < 0 || bsize->y_ppem < 0 )
        {
          FT_TRACE0(( "FT_Open_Face:"
                      " Invalid bitmap dimensions for strike %d,"
                      " now disabled\n", i ));
          bsize->width  = 0;
          bsize->height = 0;
          bsize->size   = 0;
          bsize->x_ppem = 0;
          bsize->y_ppem = 0;
        }
      }
    }

    /* initialize internal face data */
    {
      FT_Face_Internal  internal = face->internal;


      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      internal->refcount = 1;

      internal->no_stem_darkening = -1;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
      /* Per-face filtering can only be set up by FT_Face_Properties */
      internal->lcd_filter_func = NULL;
#endif
    }

    if ( aface )
      *aface = face;
    else
      FT_Done_Face( face );

    goto Exit;

  Fail:
    if ( node )
      FT_Done_Face( face );    /* face must be in the driver's list */
    else if ( face )
      destroy_face( memory, face, driver );

  Exit:
#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !error && face_index < 0 )
    {
      FT_TRACE3(( "FT_Open_Face: The font has %ld face%s\n"
                  "              and %ld named instance%s for face %ld\n",
                  face->num_faces,
                  face->num_faces == 1 ? "" : "s",
                  face->style_flags >> 16,
                  ( face->style_flags >> 16 ) == 1 ? "" : "s",
                  -face_index - 1 ));
    }
#endif

    FT_TRACE4(( "FT_Open_Face: Return 0x%x\n", error ));

    return error;
  }